

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_14::FieldValuePrinterWrapper::PrintBool
          (FieldValuePrinterWrapper *this,bool val,BaseTextGenerator *generator)

{
  FieldValuePrinter *pFVar1;
  undefined7 in_register_00000031;
  undefined8 local_30;
  undefined8 local_28;
  
  pFVar1 = (this->delegate_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           .super__Head_base<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_false>.
           _M_head_impl;
  (*pFVar1->_vptr_FieldValuePrinter[2])
            (&local_30,pFVar1,CONCAT71(in_register_00000031,val) & 0xffffffff);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_30,local_28);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void PrintBool(bool val,
                 TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintBool(val));
  }